

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O1

UConverterSharedData *
ucnv_loadSharedData_63
          (char *converterName,UConverterNamePieces *pPieces,UConverterLoadArgs *pArgs,
          UErrorCode *err)

{
  char cVar1;
  UErrorCode *pUVar2;
  UConverterLoadArgs *pArgs_00;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  UConverterSharedData *pUVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  UBool mayContainOption;
  UErrorCode internalErrorCode;
  char strippedName [60];
  UConverterLoadArgs stackArgs;
  UConverterNamePieces stackPieces;
  UBool local_18d;
  UErrorCode local_18c;
  UErrorCode *local_188;
  UConverterLoadArgs *local_180;
  char local_178 [64];
  UConverterLoadArgs local_138;
  UConverterNamePieces local_110;
  
  local_18c = U_ZERO_ERROR;
  local_18d = '\x01';
  if (U_ZERO_ERROR < *err) {
    return (UConverterSharedData *)0x0;
  }
  if (pPieces == (UConverterNamePieces *)0x0) {
    if (pArgs != (UConverterLoadArgs *)0x0) {
      *err = U_INTERNAL_PROGRAM_ERROR;
      return (UConverterSharedData *)0x0;
    }
    pcVar5 = local_110.locale;
    pPieces = &local_110;
  }
  else {
    pcVar5 = pPieces->locale;
  }
  if (pArgs == (UConverterLoadArgs *)0x0) {
    pArgs = &local_138;
    local_138.onlyTestIsLoadable = '\0';
    local_138.reserved0 = '\0';
    local_138.reserved = 0;
    local_138.options = 0;
    local_138.pkg = (char *)0x0;
    local_138.name = (char *)0x0;
    local_138.locale = (char *)0x0;
    local_138.size = 0x28;
    local_138.nestedLoads = 0;
  }
  pPieces->cnvName[0] = '\0';
  pPieces->locale[0] = '\0';
  pPieces->options = 0;
  pArgs->name = converterName;
  pArgs->locale = pcVar5;
  pArgs->options = 0;
  if (converterName != (char *)0x0) {
    if (*converterName == 'u') {
      if ((converterName[1] != 't') || (converterName[2] != 'f')) goto LAB_00161808;
    }
    else if ((*converterName != 'U') || ((converterName[1] != 'T' || (converterName[2] != 'F'))))
    goto LAB_00161808;
    if (converterName[3] == '8') {
      cVar1 = converterName[4];
    }
    else {
      if ((converterName[3] != '-') || (converterName[4] != '8')) goto LAB_00161808;
      cVar1 = converterName[5];
    }
    if (cVar1 != '\0') {
LAB_00161808:
      parseConverterOptions(converterName,pPieces,pArgs,err);
      if (U_ZERO_ERROR < *err) {
        return (UConverterSharedData *)0x0;
      }
      pcVar5 = ucnv_io_getConverterName_63(pArgs->name,&local_18d,&local_18c);
      pArgs->name = pcVar5;
      if ((local_18c < U_ILLEGAL_ARGUMENT_ERROR) && (pcVar5 != (char *)0x0)) {
        if (local_18c == U_AMBIGUOUS_ALIAS_WARNING) {
          *err = U_AMBIGUOUS_ALIAS_WARNING;
        }
      }
      else {
        pArgs->name = pPieces->cnvName;
      }
      if ((local_18d != '\0') && ((UConverterNamePieces *)pArgs->name != pPieces)) {
        parseConverterOptions(pArgs->name,pPieces,pArgs,err);
      }
      local_188 = err;
      local_180 = pArgs;
      ucnv_io_stripASCIIForCompare_63(local_178,pArgs->name);
      pUVar6 = (UConverterSharedData *)0x0;
      uVar10 = 0x11;
      uVar8 = 0;
      uVar11 = 0x22;
      while( true ) {
        uVar9 = (uint)uVar10;
        iVar3 = strcmp(local_178,cnvNameType[uVar10].name);
        pArgs_00 = local_180;
        uVar7 = uVar9;
        if ((-1 < iVar3) && (uVar8 = uVar10, uVar7 = uVar11, iVar3 == 0)) break;
        uVar4 = uVar7 + (int)uVar8 >> 1;
        uVar10 = (ulong)uVar4;
        uVar11 = uVar7;
        if (uVar9 == uVar4) {
LAB_001618e8:
          if (pUVar6 != (UConverterSharedData *)0x0) {
            return pUVar6;
          }
          local_180->nestedLoads = 1;
          local_180->pkg = (char *)0x0;
          umtx_lock_63(&cnvCacheMutex);
          pUVar2 = local_188;
          pUVar6 = ucnv_load_63(pArgs_00,local_188);
          umtx_unlock_63(&cnvCacheMutex);
          if (U_ZERO_ERROR < *pUVar2) {
            return (UConverterSharedData *)0x0;
          }
          return pUVar6;
        }
      }
      pUVar6 = converterData[cnvNameType[uVar10].type];
      goto LAB_001618e8;
    }
  }
  pArgs->name = "UTF-8";
  return &_UTF8Data_63;
}

Assistant:

U_CFUNC UConverterSharedData *
ucnv_loadSharedData(const char *converterName,
                    UConverterNamePieces *pPieces,
                    UConverterLoadArgs *pArgs,
                    UErrorCode * err) {
    UConverterNamePieces stackPieces;
    UConverterLoadArgs stackArgs;
    UConverterSharedData *mySharedConverterData = NULL;
    UErrorCode internalErrorCode = U_ZERO_ERROR;
    UBool mayContainOption = TRUE;
    UBool checkForAlgorithmic = TRUE;

    if (U_FAILURE (*err)) {
        return NULL;
    }

    if(pPieces == NULL) {
        if(pArgs != NULL) {
            /*
             * Bad: We may set pArgs pointers to stackPieces fields
             * which will be invalid after this function returns.
             */
            *err = U_INTERNAL_PROGRAM_ERROR;
            return NULL;
        }
        pPieces = &stackPieces;
    }
    if(pArgs == NULL) {
        uprv_memset(&stackArgs, 0, sizeof(stackArgs));
        stackArgs.size = (int32_t)sizeof(stackArgs);
        pArgs = &stackArgs;
    }

    pPieces->cnvName[0] = 0;
    pPieces->locale[0] = 0;
    pPieces->options = 0;

    pArgs->name = converterName;
    pArgs->locale = pPieces->locale;
    pArgs->options = pPieces->options;

    /* In case "name" is NULL we want to open the default converter. */
    if (converterName == NULL) {
#if U_CHARSET_IS_UTF8
        pArgs->name = "UTF-8";
        return (UConverterSharedData *)converterData[UCNV_UTF8];
#else
        /* Call ucnv_getDefaultName first to query the name from the OS. */
        pArgs->name = ucnv_getDefaultName();
        if (pArgs->name == NULL) {
            *err = U_MISSING_RESOURCE_ERROR;
            return NULL;
        }
        mySharedConverterData = (UConverterSharedData *)gDefaultAlgorithmicSharedData;
        checkForAlgorithmic = FALSE;
        mayContainOption = gDefaultConverterContainsOption;
        /* the default converter name is already canonical */
#endif
    }
    else if(UCNV_FAST_IS_UTF8(converterName)) {
        /* fastpath for UTF-8 */
        pArgs->name = "UTF-8";
        return (UConverterSharedData *)converterData[UCNV_UTF8];
    }
    else {
        /* separate the converter name from the options */
        parseConverterOptions(converterName, pPieces, pArgs, err);
        if (U_FAILURE(*err)) {
            /* Very bad name used. */
            return NULL;
        }

        /* get the canonical converter name */
        pArgs->name = ucnv_io_getConverterName(pArgs->name, &mayContainOption, &internalErrorCode);
        if (U_FAILURE(internalErrorCode) || pArgs->name == NULL) {
            /*
            * set the input name in case the converter was added
            * without updating the alias table, or when there is no alias table
            */
            pArgs->name = pPieces->cnvName;
        } else if (internalErrorCode == U_AMBIGUOUS_ALIAS_WARNING) {
            *err = U_AMBIGUOUS_ALIAS_WARNING;
        }
    }

    /* separate the converter name from the options */
    if(mayContainOption && pArgs->name != pPieces->cnvName) {
        parseConverterOptions(pArgs->name, pPieces, pArgs, err);
    }

    /* get the shared data for an algorithmic converter, if it is one */
    if (checkForAlgorithmic) {
        mySharedConverterData = (UConverterSharedData *)getAlgorithmicTypeFromName(pArgs->name);
    }
    if (mySharedConverterData == NULL)
    {
        /* it is a data-based converter, get its shared data.               */
        /* Hold the cnvCacheMutex through the whole process of checking the */
        /*   converter data cache, and adding new entries to the cache      */
        /*   to prevent other threads from modifying the cache during the   */
        /*   process.                                                       */
        pArgs->nestedLoads=1;
        pArgs->pkg=NULL;

        umtx_lock(&cnvCacheMutex);
        mySharedConverterData = ucnv_load(pArgs, err);
        umtx_unlock(&cnvCacheMutex);
        if (U_FAILURE (*err) || (mySharedConverterData == NULL))
        {
            return NULL;
        }
    }

    return mySharedConverterData;
}